

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

void __thiscall HEkkDual::majorUpdateFtranPrepare(HEkkDual *this)

{
  int iVar1;
  HVector *column;
  HVectorBase<double> *this_00;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  HVector_ptr *ppHVar7;
  double dVar8;
  
  HVectorBase<double>::clear(&this->col_BFRT);
  if (0 < this->multi_nFinish) {
    uVar6 = 0;
    do {
      column = this->multi_finish[uVar6].col_BFRT;
      HighsSparseMatrix::collectAj
                (this->a_matrix,column,this->multi_finish[uVar6].variable_in,
                 this->multi_finish[uVar6].theta_primal);
      uVar4 = uVar6;
      if (uVar6 != 0) {
        do {
          uVar3 = uVar4 - 1 & 0xffffffff;
          if ((long)column->count < 1) {
            dVar8 = 0.0;
          }
          else {
            dVar8 = 0.0;
            lVar5 = 0;
            do {
              iVar1 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5];
              dVar8 = dVar8 + (column->array).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[iVar1] *
                              ((this->multi_finish[uVar3].row_ep)->array).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[iVar1];
              lVar5 = lVar5 + 1;
            } while (column->count != lVar5);
          }
          if (1e-14 < ABS(dVar8)) {
            dVar8 = dVar8 / this->multi_finish[uVar3].alpha_row;
            HighsSparseMatrix::collectAj
                      (this->a_matrix,column,this->multi_finish[uVar3].variable_in,-dVar8);
            HighsSparseMatrix::collectAj
                      (this->a_matrix,column,this->multi_finish[uVar3].variable_out,dVar8);
          }
          bVar2 = 1 < (long)uVar4;
          uVar4 = uVar4 - 1;
        } while (bVar2);
      }
      HVectorBase<double>::saxpy<double,double>(&this->col_BFRT,1.0,column);
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)this->multi_nFinish);
  }
  if (0 < this->multi_nFinish) {
    ppHVar7 = &this->multi_finish[0].col_aq;
    lVar5 = 0;
    do {
      this_00 = *ppHVar7;
      HVectorBase<double>::clear(this_00);
      this_00->packFlag = true;
      HighsSparseMatrix::collectAj(this->a_matrix,this_00,*(HighsInt *)(ppHVar7 + -7),1.0);
      lVar5 = lVar5 + 1;
      ppHVar7 = ppHVar7 + 0xf;
    } while (lVar5 < this->multi_nFinish);
  }
  return;
}

Assistant:

void HEkkDual::majorUpdateFtranPrepare() {
  // Prepare FTRAN BFRT buffer
  col_BFRT.clear();
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HVector* Vec = finish->col_BFRT;
    a_matrix->collectAj(*Vec, finish->variable_in, finish->theta_primal);

    // Update this buffer by previous Row_ep
    for (HighsInt jFn = iFn - 1; jFn >= 0; jFn--) {
      MFinish* jFinish = &multi_finish[jFn];
      double* jRow_epArray = jFinish->row_ep->array.data();
      double pivotX = 0;
      for (HighsInt k = 0; k < Vec->count; k++) {
        HighsInt iRow = Vec->index[k];
        pivotX += Vec->array[iRow] * jRow_epArray[iRow];
      }
      if (fabs(pivotX) > kHighsTiny) {
        pivotX /= jFinish->alpha_row;
        a_matrix->collectAj(*Vec, jFinish->variable_in, -pivotX);
        a_matrix->collectAj(*Vec, jFinish->variable_out, pivotX);
      }
    }
    col_BFRT.saxpy(1.0, Vec);
  }

  // Prepare regular FTRAN buffer
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* iFinish = &multi_finish[iFn];
    HVector* iColumn = iFinish->col_aq;
    iColumn->clear();
    iColumn->packFlag = true;
    a_matrix->collectAj(*iColumn, iFinish->variable_in, 1);
  }
}